

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O3

void b2CollidePolygons(btManifoldResult *manifold,btBox2dShape *polyA,btTransform *xfA,
                      btBox2dShape *polyB,btTransform *xfB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  int iVar11;
  btTransform *pbVar12;
  int iVar13;
  btBox2dShape *pbVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  btScalar *pbVar18;
  ulong uVar19;
  ulong uVar20;
  btVector3 *pbVar21;
  ClipVertex *vOut;
  btScalar bVar22;
  btScalar bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined4 uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  int edgeB;
  int edgeA;
  ClipVertex incidentEdge [2];
  float local_1e8;
  float fStack_1e4;
  int local_1c0 [2];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  btVector3 local_138;
  btVector3 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  ClipVertex local_b8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  ClipVertex local_88;
  undefined8 local_74;
  undefined8 uStack_6c;
  ClipVertex local_58;
  undefined1 local_44 [16];
  
  local_1c0[1] = 0;
  bVar22 = FindMaxSeparation(local_1c0 + 1,polyA,xfA,polyB,xfB);
  if (bVar22 <= 0.0) {
    local_1c0[0] = 0;
    bVar23 = FindMaxSeparation(local_1c0,polyB,xfB,polyA,xfA);
    if (bVar23 <= 0.0) {
      fVar27 = bVar22 * 0.98 + 0.001;
      pbVar14 = polyA;
      pbVar12 = xfA;
      if (bVar23 <= fVar27) {
        pbVar14 = polyB;
        pbVar12 = xfB;
        xfB = xfA;
      }
      fVar32 = (xfB->m_basis).m_el[2].m_floats[2];
      fVar36 = (xfB->m_basis).m_el[2].m_floats[1];
      fVar25 = (xfB->m_basis).m_el[2].m_floats[0];
      fVar28 = (xfB->m_basis).m_el[1].m_floats[2];
      fVar40 = (xfB->m_basis).m_el[1].m_floats[1];
      fVar1 = (xfB->m_basis).m_el[1].m_floats[0];
      fVar34 = (xfB->m_basis).m_el[0].m_floats[2];
      fVar2 = (xfB->m_basis).m_el[0].m_floats[0];
      fVar3 = (xfB->m_basis).m_el[0].m_floats[1];
      fVar24 = (pbVar12->m_basis).m_el[0].m_floats[0];
      piVar16 = local_1c0;
      if (bVar23 <= fVar27) {
        piVar16 = local_1c0 + 1;
      }
      iVar13 = *piVar16;
      if (bVar23 <= fVar27) {
        polyB = polyA;
      }
      fVar26 = polyB->m_normals[iVar13].m_floats[0];
      fVar39 = polyB->m_normals[iVar13].m_floats[1];
      local_1a8 = ZEXT416((uint)fVar3);
      local_198 = ZEXT416((uint)fVar2);
      fVar29 = polyB->m_normals[iVar13].m_floats[2];
      local_188 = ZEXT416((uint)fVar34);
      fVar37 = fVar34 * fVar29 + fVar2 * fVar26 + fVar3 * fVar39;
      local_178 = ZEXT416((uint)fVar40);
      local_168 = ZEXT416((uint)fVar1);
      local_158 = ZEXT416((uint)fVar28);
      fVar31 = fVar28 * fVar29 + fVar1 * fVar26 + fVar40 * fVar39;
      fVar30 = (pbVar12->m_basis).m_el[1].m_floats[0];
      fVar43 = fVar29 * fVar32 + fVar26 * fVar25 + fVar39 * fVar36;
      fVar26 = (pbVar12->m_basis).m_el[2].m_floats[0];
      fVar39 = (pbVar12->m_basis).m_el[1].m_floats[1];
      fVar29 = (pbVar12->m_basis).m_el[0].m_floats[1];
      fVar33 = (pbVar12->m_basis).m_el[2].m_floats[1];
      fVar35 = (pbVar12->m_basis).m_el[1].m_floats[2];
      fVar4 = (pbVar12->m_basis).m_el[0].m_floats[2];
      fVar5 = (pbVar12->m_basis).m_el[2].m_floats[2];
      pbVar18 = pbVar14->m_normals[0].m_floats + 2;
      uVar20 = 0;
      uVar19 = 0;
      fVar6 = (xfB->m_origin).m_floats[2];
      fVar7 = (xfB->m_origin).m_floats[1];
      fVar8 = (xfB->m_origin).m_floats[0];
      fVar9 = (pbVar12->m_origin).m_floats[2];
      uVar10 = *(undefined8 *)(pbVar12->m_origin).m_floats;
      fVar38 = (float)uVar10;
      fVar41 = (float)((ulong)uVar10 >> 0x20);
      fVar44 = 1e+18;
      do {
        fVar45 = *pbVar18 * (fVar43 * fVar5 + fVar37 * fVar4 + fVar31 * fVar35) +
                 ((btVector3 *)(pbVar18 + -2))->m_floats[0] *
                 (fVar26 * fVar43 + fVar24 * fVar37 + fVar30 * fVar31) +
                 pbVar18[-1] * (fVar33 * fVar43 + fVar29 * fVar37 + fVar39 * fVar31);
        if (fVar45 < fVar44) {
          uVar19 = uVar20 & 0xffffffff;
          fVar44 = fVar45;
        }
        uVar20 = uVar20 + 1;
        pbVar18 = pbVar18 + 4;
      } while (uVar20 != 4);
      iVar11 = (int)uVar19;
      iVar17 = 0;
      if (iVar11 < 3) {
        iVar17 = iVar11 + 1;
      }
      fVar44 = pbVar14->m_vertices[iVar11].m_floats[0];
      fVar31 = pbVar14->m_vertices[iVar11].m_floats[1];
      fVar37 = pbVar14->m_vertices[iVar11].m_floats[2];
      local_58.v.m_floats[1] = fVar37 * fVar35 + fVar44 * fVar30 + fVar31 * fVar39 + fVar41;
      local_58.v.m_floats[0] = fVar37 * fVar4 + fVar44 * fVar24 + fVar31 * fVar29 + fVar38;
      local_58.v.m_floats[2] = fVar37 * fVar5 + fVar44 * fVar26 + fVar33 * fVar31 + fVar9;
      local_58.v.m_floats[3] = 0.0;
      fVar44 = pbVar14->m_vertices[iVar17].m_floats[0];
      fVar31 = pbVar14->m_vertices[iVar17].m_floats[1];
      fVar37 = pbVar14->m_vertices[iVar17].m_floats[2];
      local_44._4_4_ = fVar37 * fVar35 + fVar44 * fVar30 + fVar31 * fVar39 + fVar41;
      local_44._0_4_ = fVar37 * fVar4 + fVar44 * fVar24 + fVar31 * fVar29 + fVar38;
      local_44._8_4_ = fVar5 * fVar37 + fVar26 * fVar44 + fVar33 * fVar31 + fVar9;
      local_44._12_4_ = 0;
      uVar10 = *(undefined8 *)polyB->m_vertices[iVar13].m_floats;
      fVar24 = (float)uVar10;
      fVar26 = (float)((ulong)uVar10 >> 0x20);
      uVar10 = *(undefined8 *)(polyB->m_vertices[iVar13].m_floats + 2);
      fVar39 = (float)uVar10;
      uVar42 = (undefined4)((ulong)uVar10 >> 0x20);
      pbVar21 = polyB->m_vertices;
      if (iVar13 < 3) {
        pbVar21 = polyB->m_vertices + (long)iVar13 + 1;
      }
      local_e8 = *(undefined8 *)pbVar21->m_floats;
      local_f8 = (float)((ulong)local_e8 >> 0x20);
      local_d8 = *(undefined8 *)(pbVar21->m_floats + 2);
      uStack_e0 = 0;
      fVar33 = (float)local_e8 - fVar24;
      fVar35 = local_f8 - fVar26;
      uStack_d0 = 0;
      fVar29 = (float)local_d8 - fVar39;
      local_128.m_floats[2] = fVar32 * fVar29 + fVar25 * fVar33 + fVar36 * fVar35;
      local_1b8 = fVar29 * fVar34 + fVar33 * fVar2 + fVar35 * fVar3;
      fVar30 = fVar29 * fVar28 + fVar33 * fVar1 + fVar35 * fVar40;
      fStack_1ac = 1.0 / SQRT(local_128.m_floats[2] * local_128.m_floats[2] +
                              local_1b8 * local_1b8 + fVar30 * fVar30);
      local_128.m_floats[2] = local_128.m_floats[2] * fStack_1ac;
      local_1b8 = fStack_1ac * local_1b8;
      fVar30 = fStack_1ac * fVar30;
      fStack_1b0 = fStack_1ac * (fVar29 * 0.0 + fVar33 * 0.0 + fVar35 * 0.0);
      fStack_1ac = fStack_1ac * (fVar29 * 0.0 + fVar33 * 0.0 + fVar35 * 0.0);
      local_128.m_floats[1] = fVar30;
      local_128.m_floats[0] = local_1b8;
      fVar34 = fVar39 * fVar34 + fVar24 * fVar2 + fVar3 * fVar26 + fVar8;
      fVar28 = fVar39 * fVar28 + fVar24 * fVar1 + fVar40 * fVar26 + fVar7;
      fVar40 = fVar39 * fVar32 + fVar24 * fVar25 + fVar26 * fVar36 + fVar6;
      local_118 = CONCAT44(uVar42,fVar28);
      uStack_110 = 0;
      local_108 = CONCAT44(uVar42,fVar34);
      uStack_100 = 0;
      local_88.v.m_floats[0] = 0.0;
      local_88.v.m_floats[1] = 0.0;
      local_88.v.m_floats[2] = 0.0;
      local_88.v.m_floats[3] = 0.0;
      local_74 = 0;
      uStack_6c = 0;
      local_b8.v.m_floats[0] = 0.0;
      local_b8.v.m_floats[1] = 0.0;
      local_b8.v.m_floats[2] = 0.0;
      local_b8.v.m_floats[3] = 0.0;
      local_a4 = 0;
      uStack_9c = 0;
      local_148 = -local_1b8;
      fStack_144 = -fVar30;
      fStack_140 = -fStack_1b0;
      fStack_13c = -fStack_1ac;
      uVar19 = CONCAT44(fVar30,local_1b8) ^ 0x8000000080000000;
      local_138.m_floats[2] = -local_128.m_floats[2];
      local_138.m_floats[0] = (btScalar)(int)uVar19;
      local_138.m_floats[1] = (btScalar)(int)(uVar19 >> 0x20);
      local_138.m_floats[3] = 0.0;
      local_c8 = ZEXT416((uint)local_128.m_floats[2]);
      local_128.m_floats[3] = 0.0;
      fStack_1b4 = fVar30;
      fStack_f4 = local_f8;
      fStack_f0 = local_f8;
      fStack_ec = local_f8;
      iVar13 = ClipSegmentToLine(&local_88,&local_58,&local_138,
                                 -(local_128.m_floats[2] * fVar40 +
                                  local_1b8 * fVar34 + fVar28 * fVar30));
      if (1 < iVar13) {
        vOut = &local_b8;
        iVar13 = ClipSegmentToLine(vOut,&local_88,&local_128,
                                   (float)local_c8._0_4_ *
                                   (fVar6 + fVar32 * (float)local_d8 +
                                            fVar25 * (float)local_e8 + fVar36 * local_f8) +
                                   (fVar8 + (float)local_188._0_4_ * (float)local_d8 +
                                            (float)local_198._0_4_ * (float)local_e8 +
                                            (float)local_1a8._0_4_ * local_f8) * local_1b8 +
                                   (fVar7 + (float)local_158._0_4_ * (float)local_d8 +
                                            (float)local_168._0_4_ * (float)local_e8 +
                                            (float)local_178._0_4_ * local_f8) * fVar30);
        if ((1 < iVar13) && (0 < b2_maxManifoldPoints)) {
          fVar25 = (float)local_118 * local_148;
          fVar28 = (float)local_108 * fVar30;
          fVar32 = fVar30;
          fVar36 = local_148;
          if (fVar27 < bVar23) {
            fVar32 = fStack_144;
            fVar36 = local_1b8;
          }
          local_1e8 = -fVar32;
          fStack_1e4 = -fVar36;
          lVar15 = 0;
          uVar19 = CONCAT44(fVar36,fVar32) ^ 0x8000000080000000;
          fVar32 = local_148;
          iVar13 = b2_maxManifoldPoints;
          do {
            if (((vOut->v).m_floats[2] * 0.0 +
                (vOut->v).m_floats[0] * fVar30 + (vOut->v).m_floats[1] * fVar32) -
                (fVar40 * 0.0 + fVar28 + fVar25) <= 0.0) {
              local_138.m_floats[1] = fStack_1e4;
              local_138.m_floats[0] = local_1e8;
              local_138.m_floats[2] = (btScalar)(-(uint)(bVar23 <= fVar27) & 0x80000000);
              local_138.m_floats[3] = 0.0;
              (*(manifold->super_Result)._vptr_Result[4])(manifold,&local_138,vOut);
              local_1e8 = (float)uVar19;
              fStack_1e4 = (float)(uVar19 >> 0x20);
              fVar32 = local_148;
              iVar13 = b2_maxManifoldPoints;
            }
            lVar15 = lVar15 + 1;
            vOut = vOut + 1;
          } while (lVar15 < iVar13);
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(btManifoldResult* manifold,
					  const btBox2dShape* polyA, const btTransform& xfA,
					  const btBox2dShape* polyB, const btTransform& xfB)
{

	int edgeA = 0;
	btScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	btScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const btBox2dShape* poly1;	// reference poly
	const btBox2dShape* poly2;	// incident poly
	btTransform xf1, xf2;
	int edge1;		// reference edge
	unsigned char flip;
	const btScalar k_relativeTol = 0.98f;
	const btScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const btVector3* vertices1 = poly1->getVertices();

	btVector3 v11 = vertices1[edge1];
	btVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1+1] : vertices1[0];

	//btVector3 dv = v12 - v11;
	btVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	btVector3 frontNormal = btCrossS(sideNormal, 1.0f);
	
	
	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	btScalar frontOffset = b2Dot(frontNormal, v11);
	btScalar sideOffset1 = -b2Dot(sideNormal, v11);
	btScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0,0,0);
	clipPoints1[1].v.setValue(0,0,0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0,0,0);
	clipPoints2[1].v.setValue(0,0,0);


	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1,  sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	btVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		btScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//btScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal,clipPoints2[i].v,separation);

//			cp->id = clipPoints2[i].id;
//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

//	manifold->pointCount = pointCount;}
}